

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.hpp
# Opt level: O0

bool __thiscall tl::StrT<char32_t>::operator!=(StrT<char32_t> *this,CStrT<char32_t> o)

{
  bool bVar1;
  CStrT<char32_t> o_00;
  StrT<char32_t> *this_local;
  CStrT<char32_t> o_local;
  
  o_00._str = o._str;
  o_00._size = o._size;
  o_00._4_4_ = 0;
  bVar1 = operator==(this,o_00);
  return (bool)((bVar1 ^ 0xffU) & 1);
}

Assistant:

bool operator!=(CStrT<CharT> o)const { return !(*this == o); }